

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void __thiscall Fl_Widget_Type::write_extra_code(Fl_Widget_Type *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int local_14;
  int n;
  Fl_Widget_Type *this_local;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    pcVar2 = extra_code(this,local_14);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = extra_code(this,local_14);
      iVar1 = isdeclare(pcVar2);
      if (iVar1 == 0) {
        pcVar2 = indent();
        pcVar3 = extra_code(this,local_14);
        write_c("%s%s\n",pcVar2,pcVar3);
      }
    }
  }
  return;
}

Assistant:

void Fl_Widget_Type::write_extra_code() {
  for (int n=0; n < NUM_EXTRA_CODE; n++)
    if (extra_code(n) && !isdeclare(extra_code(n)))
      write_c("%s%s\n", indent(), extra_code(n));
}